

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O2

_Bool Curl_conn_seems_dead(connectdata *conn,Curl_easy *data,curltime *pnow)

{
  curl_trc_feat *pcVar1;
  long lVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  _Bool _Var7;
  _Bool _Var8;
  uint uVar9;
  size_t sVar10;
  time_t tVar11;
  timediff_t tVar12;
  long lVar13;
  int iVar14;
  char *fmt;
  curltime cVar15;
  curltime newer;
  curltime older;
  curltime older_00;
  _Bool input_pending;
  
  sVar10 = Curl_llist_count(&conn->easyq);
  if (sVar10 != 0) {
    return false;
  }
  if (pnow == (curltime *)0x0) {
    cVar15 = Curl_now();
    tVar11 = cVar15.tv_sec;
    iVar14 = cVar15.tv_usec;
  }
  else {
    tVar11 = pnow->tv_sec;
    iVar14 = pnow->tv_usec;
  }
  uVar3 = (conn->lastused).tv_sec;
  uVar4 = (conn->lastused).tv_usec;
  older.tv_usec = uVar4;
  older.tv_sec = uVar3;
  cVar15.tv_usec = iVar14;
  cVar15.tv_sec = tVar11;
  cVar15._12_4_ = 0;
  older._12_4_ = 0;
  tVar12 = Curl_timediff(cVar15,older);
  lVar13 = tVar12 / 1000;
  if ((data->set).maxage_conn < lVar13) {
    if ((((data->set).field_0x8cd & 0x10) == 0) ||
       ((pcVar1 = (data->state).feat, pcVar1 != (curl_trc_feat *)0x0 && (pcVar1->log_level < 1))))
    goto LAB_0015983c;
    fmt = "Too old connection (%ld seconds idle), disconnect it";
  }
  else {
    uVar5 = (conn->created).tv_sec;
    uVar6 = (conn->created).tv_usec;
    older_00.tv_usec = uVar6;
    older_00.tv_sec = uVar5;
    newer.tv_usec = iVar14;
    newer.tv_sec = tVar11;
    newer._12_4_ = 0;
    older_00._12_4_ = 0;
    tVar12 = Curl_timediff(newer,older_00);
    lVar13 = tVar12 / 1000;
    lVar2 = (data->set).maxlifetime_conn;
    if ((lVar2 == 0) || (lVar13 <= lVar2)) {
      if (conn->handler->connection_check == (_func_uint_Curl_easy_ptr_connectdata_ptr_uint *)0x0) {
        input_pending = false;
        Curl_attach_connection(data,conn);
        _Var8 = Curl_conn_is_alive(data,conn,&input_pending);
        _Var7 = input_pending;
        Curl_detach_connection(data);
        if ((_Var7 == false) && (_Var8)) {
          return false;
        }
      }
      else {
        Curl_attach_connection(data,conn);
        uVar9 = (*conn->handler->connection_check)(data,conn,1);
        Curl_detach_connection(data);
        if ((uVar9 & 1) == 0) {
          return false;
        }
      }
      goto LAB_0015983c;
    }
    if ((((data->set).field_0x8cd & 0x10) == 0) ||
       ((pcVar1 = (data->state).feat, pcVar1 != (curl_trc_feat *)0x0 && (pcVar1->log_level < 1))))
    goto LAB_0015983c;
    fmt = "Too old connection (%ld seconds since creation), disconnect it";
  }
  Curl_infof(data,fmt,lVar13);
LAB_0015983c:
  if ((((data->set).field_0x8cd & 0x10) != 0) &&
     ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 || (0 < pcVar1->log_level)))) {
    Curl_infof(data,"Connection %ld seems to be dead",conn->connection_id);
  }
  return true;
}

Assistant:

bool Curl_conn_seems_dead(struct connectdata *conn,
                          struct Curl_easy *data,
                          struct curltime *pnow)
{
  DEBUGASSERT(!data->conn);
  if(!CONN_INUSE(conn)) {
    /* The check for a dead socket makes sense only if the connection is not in
       use */
    bool dead;
    struct curltime now;
    if(!pnow) {
      now = Curl_now();
      pnow = &now;
    }

    if(conn_maxage(data, conn, *pnow)) {
      /* avoid check if already too old */
      dead = TRUE;
    }
    else if(conn->handler->connection_check) {
      /* The protocol has a special method for checking the state of the
         connection. Use it to check if the connection is dead. */
      unsigned int state;

      /* briefly attach the connection to this transfer for the purpose of
         checking it */
      Curl_attach_connection(data, conn);

      state = conn->handler->connection_check(data, conn, CONNCHECK_ISDEAD);
      dead = (state & CONNRESULT_DEAD);
      /* detach the connection again */
      Curl_detach_connection(data);

    }
    else {
      bool input_pending = FALSE;

      Curl_attach_connection(data, conn);
      dead = !Curl_conn_is_alive(data, conn, &input_pending);
      if(input_pending) {
        /* For reuse, we want a "clean" connection state. The includes
         * that we expect - in general - no waiting input data. Input
         * waiting might be a TLS Notify Close, for example. We reject
         * that.
         * For protocols where data from other end may arrive at
         * any time (HTTP/2 PING for example), the protocol handler needs
         * to install its own `connection_check` callback.
         */
        DEBUGF(infof(data, "connection has input pending, not reusable"));
        dead = TRUE;
      }
      Curl_detach_connection(data);
    }

    if(dead) {
      /* remove connection from cpool */
      infof(data, "Connection %" FMT_OFF_T " seems to be dead",
            conn->connection_id);
      return TRUE;
    }
  }
  return FALSE;
}